

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

void __thiscall
HermiteSpline<5U,_2U>::walk
          (HermiteSpline<5U,_2U> *this,double deltatau,
          _func_void_VectorNd_HermiteSpline<5U,_2U>_ptr_double_Polynomial_ptr_void_ptr *fn,
          void *payload)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  pointer *ppUVar4;
  pointer pUVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  pointer pUVar9;
  double dVar10;
  double dVar11;
  VectorNd VVar12;
  pointer local_68;
  double local_60;
  double local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  
  pUVar5 = (this->children).
           super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar5) {
    uVar8 = 0;
    local_58 = 0.0;
    local_60 = deltatau;
    do {
      VVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = local_58 / pUVar5[uVar8].length;
      lVar6 = 0;
      ppUVar4 = &local_68;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        pUVar9 = (pointer)0x0;
        lVar7 = 0;
        dVar10 = 1.0;
        do {
          dVar11 = VVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                   m_data.array[0] * dVar10;
          pUVar9 = (pointer)((double)pUVar9 + dVar10 * pUVar5[uVar8]._dims[lVar6].coeffs[lVar7]);
          lVar7 = lVar7 + 1;
          dVar10 = dVar11;
        } while (lVar7 != 6);
        *ppUVar4 = pUVar9;
        lVar6 = 1;
        ppUVar4 = &local_50;
        bVar1 = false;
      } while (bVar2);
      local_48 = local_68;
      local_40 = local_50;
      VVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = (double)local_50;
      (*fn)(VVar12,(HermiteSpline<5U,_2U> *)&local_48,dVar11,(Polynomial *)this,pUVar5 + uVar8);
      dVar10 = local_58 + local_60;
      pUVar5 = (this->children).
               super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = dVar10 != pUVar5[uVar8].length;
      bVar2 = pUVar5[uVar8].length <= dVar10;
      local_58 = 0.0;
      if (!bVar2 || !bVar1) {
        local_58 = dVar10;
      }
      uVar8 = (ulong)((int)uVar8 + (uint)(bVar2 && bVar1));
      uVar3 = ((long)(this->children).
                     super__Vector_base<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
              0x4ec4ec4ec4ec4ec5;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  return;
}

Assistant:

void HermiteSpline<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, HermiteSpline<Order, Dims>&, double, UnitBoundedPolynomial<Order, Dims>&, void *), void *payload)
{
    double tau = 0.0;
    int m = 0;

    while (m < children.size())
    {
        double reltau = tau / children[m].length;
        VectorNd pt = children[m].interpolate(reltau);

        fn(pt, *this, reltau, children[m], payload);
        tau += deltatau;

        if (tau > children[m].length)
        {
            tau = 0.0;
            m++;
        }
    }
}